

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  xml_attribute_struct *pxVar1;
  xpath_node *pxVar2;
  bool bVar3;
  xpath_node *rhs;
  xpath_node *rhs_00;
  xpath_node *extraout_RDX;
  xpath_node *pxVar4;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *pxVar5;
  xpath_node *pxVar6;
  xpath_node *this;
  ulong uVar7;
  xpath_node val;
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  xpath_node *local_50;
  xpath_node *local_48;
  xpath_node local_40;
  
  uVar7 = (long)end - (long)begin >> 4;
  if (0x10 < (long)uVar7) {
    pxVar5 = begin;
    do {
      pxVar6 = pxVar5 + (uVar7 >> 1);
      local_48 = end;
      bVar3 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar6,pxVar5,(xpath_node *)pred);
      pxVar4 = pxVar6;
      pxVar2 = pxVar5;
      if (bVar3) {
        pxVar4 = pxVar5;
        pxVar2 = pxVar6;
      }
      bVar3 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)(end + -1),pxVar4,rhs);
      if (bVar3) {
        pxVar4 = end + -1;
      }
      bVar3 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar4,pxVar2,rhs_00);
      if (bVar3) {
        pxVar4 = pxVar2;
      }
      local_40._node._root = (pxVar4->_node)._root;
      local_40._attribute._attr = (pxVar4->_attribute)._attr;
      pxVar4 = extraout_RDX;
      pxVar6 = pxVar5;
      this = pxVar5;
      local_50 = end;
      pxVar2 = pxVar5;
      begin = end;
      if (pxVar5 < end) {
        do {
          bVar3 = anon_unknown_0::document_order_comparator::operator()
                            ((document_order_comparator *)this,&local_40,pxVar4);
          if (bVar3) {
            this = this + 1;
          }
          else if (((this->_node)._root == local_40._node._root) &&
                  ((this->_attribute)._attr == local_40._attribute._attr)) {
            local_68 = (pxVar6->_node)._root;
            pxStack_60 = (pxVar6->_attribute)._attr;
            pxVar1 = (this->_attribute)._attr;
            (pxVar6->_node)._root = (this->_node)._root;
            (pxVar6->_attribute)._attr = pxVar1;
            pxVar6 = pxVar6 + 1;
            (this->_node)._root = local_68;
            (this->_attribute)._attr = pxStack_60;
            this = this + 1;
          }
          else {
            local_68 = (this->_node)._root;
            pxStack_60 = (this->_attribute)._attr;
            pxVar1 = end[-1]._attribute._attr;
            (this->_node)._root = end[-1]._node._root;
            (this->_attribute)._attr = pxVar1;
            end[-1]._node._root = local_68;
            end[-1]._attribute._attr = pxStack_60;
            end = end + -1;
          }
          pxVar4 = extraout_RDX_00;
          begin = end;
        } while (this < end);
      }
      for (; pxVar6 != pxVar2; pxVar2 = pxVar2 + 1) {
        local_68 = (pxVar2->_node)._root;
        pxStack_60 = (pxVar2->_attribute)._attr;
        pxVar1 = end[-1]._attribute._attr;
        (pxVar2->_node)._root = end[-1]._node._root;
        (pxVar2->_attribute)._attr = pxVar1;
        end[-1]._node._root = local_68;
        end[-1]._attribute._attr = pxStack_60;
        end = end + -1;
      }
      if ((long)local_48 - (long)begin < (long)end - (long)pxVar5) {
        sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                  (begin,local_50,(document_order_comparator *)pxVar4);
        pred = (document_order_comparator *)extraout_RDX_01;
        begin = pxVar5;
      }
      else {
        sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                  (pxVar5,end,(document_order_comparator *)pxVar4);
        pred = (document_order_comparator *)extraout_RDX_02;
        end = local_50;
      }
      uVar7 = (long)end - (long)begin >> 4;
      pxVar5 = begin;
    } while (0x10 < (long)uVar7);
  }
  pxVar5 = begin + 1;
  if (pxVar5 != end && begin != end) {
    do {
      local_68 = (pxVar5->_node)._root;
      pxStack_60 = (pxVar5->_attribute)._attr;
      pxVar2 = pxVar5;
      while (begin < pxVar2) {
        pxVar4 = pxVar2 + -1;
        bVar3 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)&local_68,pxVar4,(xpath_node *)pred);
        pred = (document_order_comparator *)extraout_RDX_03;
        if (!bVar3) break;
        pxVar1 = pxVar2[-1]._attribute._attr;
        (pxVar2->_node)._root = (pxVar4->_node)._root;
        (pxVar2->_attribute)._attr = pxVar1;
        pxVar2 = pxVar4;
      }
      (pxVar2->_node)._root = local_68;
      (pxVar2->_attribute)._attr = pxStack_60;
      pxVar5 = pxVar5 + 1;
    } while (pxVar5 != end);
  }
  return;
}

Assistant:

PUGI__FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}